

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Dropout_x86_avx512::forward_inplace(Dropout_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  float *pfVar17;
  uint uVar18;
  Mat local_68;
  
  fVar2 = (this->super_Dropout).scale;
  if (fVar2 != 1.0) {
    iVar13 = bottom_top_blob->elempack;
    iVar3 = bottom_top_blob->dims;
    if (iVar13 == 4) {
      uVar4 = bottom_top_blob->w;
      uVar5 = bottom_top_blob->h;
      uVar18 = bottom_top_blob->c;
      if (iVar3 == 3) {
        if (0 < (int)uVar18) {
          uVar15 = 1;
          if (1 < (int)uVar18) {
            uVar15 = (ulong)uVar18;
          }
          uVar14 = 0;
          do {
            if (0 < (int)(uVar5 * uVar4)) {
              pfVar17 = (float *)(bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar13 = uVar5 * uVar4;
              do {
                *pfVar17 = fVar2 * *pfVar17;
                pfVar17[1] = fVar2 * pfVar17[1];
                pfVar17[2] = fVar2 * pfVar17[2];
                pfVar17[3] = fVar2 * pfVar17[3];
                pfVar17 = pfVar17 + 4;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar15);
        }
      }
      else if (iVar3 == 2) {
        if (0 < (int)uVar5) {
          uVar15 = 0;
          do {
            if (0 < (int)uVar4) {
              pfVar17 = (float *)((long)bottom_top_blob->w * uVar15 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar14 = (ulong)uVar4;
              do {
                *pfVar17 = fVar2 * *pfVar17;
                pfVar17[1] = fVar2 * pfVar17[1];
                pfVar17[2] = fVar2 * pfVar17[2];
                pfVar17[3] = fVar2 * pfVar17[3];
                pfVar17 = pfVar17 + 4;
                uVar18 = (int)uVar14 - 1;
                uVar14 = (ulong)uVar18;
              } while (uVar18 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar5);
        }
      }
      else if ((iVar3 == 1) && (0 < (int)uVar4)) {
        lVar16 = 0;
        do {
          pfVar17 = (float *)((long)bottom_top_blob->data + lVar16);
          fVar6 = pfVar17[1];
          fVar7 = pfVar17[2];
          fVar8 = pfVar17[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar16);
          *pfVar1 = fVar2 * *pfVar17;
          pfVar1[1] = fVar2 * fVar6;
          pfVar1[2] = fVar2 * fVar7;
          pfVar1[3] = fVar2 * fVar8;
          lVar16 = lVar16 + 0x10;
        } while ((ulong)uVar4 << 4 != lVar16);
      }
    }
    else if (iVar13 == 8) {
      uVar4 = bottom_top_blob->w;
      uVar5 = bottom_top_blob->h;
      uVar18 = bottom_top_blob->c;
      if (iVar3 == 3) {
        if (0 < (int)uVar18) {
          uVar15 = 1;
          if (1 < (int)uVar18) {
            uVar15 = (ulong)uVar18;
          }
          uVar14 = 0;
          do {
            if (0 < (int)(uVar5 * uVar4)) {
              pfVar17 = (float *)(bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar13 = uVar5 * uVar4;
              do {
                *pfVar17 = fVar2 * *pfVar17;
                pfVar17[1] = fVar2 * pfVar17[1];
                pfVar17[2] = fVar2 * pfVar17[2];
                pfVar17[3] = fVar2 * pfVar17[3];
                pfVar17[4] = fVar2 * pfVar17[4];
                pfVar17[5] = fVar2 * pfVar17[5];
                pfVar17[6] = fVar2 * pfVar17[6];
                pfVar17[7] = 0.0;
                pfVar17 = pfVar17 + 8;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar15);
        }
      }
      else if (iVar3 == 2) {
        if (0 < (int)uVar5) {
          uVar15 = 0;
          do {
            if (0 < (int)uVar4) {
              pfVar17 = (float *)((long)bottom_top_blob->w * uVar15 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar14 = (ulong)uVar4;
              do {
                *pfVar17 = fVar2 * *pfVar17;
                pfVar17[1] = fVar2 * pfVar17[1];
                pfVar17[2] = fVar2 * pfVar17[2];
                pfVar17[3] = fVar2 * pfVar17[3];
                pfVar17[4] = fVar2 * pfVar17[4];
                pfVar17[5] = fVar2 * pfVar17[5];
                pfVar17[6] = fVar2 * pfVar17[6];
                pfVar17[7] = 0.0;
                pfVar17 = pfVar17 + 8;
                uVar18 = (int)uVar14 - 1;
                uVar14 = (ulong)uVar18;
              } while (uVar18 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar5);
        }
      }
      else if ((iVar3 == 1) && (0 < (int)uVar4)) {
        lVar16 = 0;
        do {
          pfVar17 = (float *)((long)bottom_top_blob->data + lVar16);
          fVar6 = pfVar17[1];
          fVar7 = pfVar17[2];
          fVar8 = pfVar17[3];
          fVar9 = pfVar17[4];
          fVar10 = pfVar17[5];
          fVar11 = pfVar17[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar16);
          *pfVar1 = fVar2 * *pfVar17;
          pfVar1[1] = fVar2 * fVar6;
          pfVar1[2] = fVar2 * fVar7;
          pfVar1[3] = fVar2 * fVar8;
          pfVar1[4] = fVar2 * fVar9;
          pfVar1[5] = fVar2 * fVar10;
          pfVar1[6] = fVar2 * fVar11;
          pfVar1[7] = 0.0;
          lVar16 = lVar16 + 0x20;
        } while ((ulong)uVar4 << 5 != lVar16);
      }
    }
    else {
      if (iVar13 != 0x10) {
        iVar13 = Dropout::forward_inplace(&this->super_Dropout,bottom_top_blob,opt);
        return iVar13;
      }
      local_68.cstep = 0;
      local_68.data = (void *)0x0;
      local_68.refcount._0_4_ = 0;
      local_68.refcount._4_4_ = 0;
      local_68.elemsize._0_4_ = 0;
      local_68._20_8_ = 0;
      local_68.allocator = (Allocator *)0x0;
      local_68.dims = 0;
      local_68._48_8_ = SUB128(ZEXT812(0),4);
      local_68.c = 0;
      local_68.w = local_68.refcount._4_4_;
      convert_packing(bottom_top_blob,&local_68,8,opt);
      (*(this->super_Dropout).super_Layer._vptr_Layer[9])(this,&local_68,opt);
      convert_packing(&local_68,bottom_top_blob,0x10,opt);
      piVar12 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_68.allocator == (Allocator *)0x0) {
            if (local_68.data != (void *)0x0) {
              free(local_68.data);
            }
          }
          else {
            (*(local_68.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}